

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O3

void __thiscall gvr::PLYWriter::addProperty(PLYWriter *this,string *name,ply_type tvalue)

{
  PLYElement *this_00;
  IOException *pIVar1;
  PLYProperty local_60;
  
  if (this->header_complete == true) {
    pIVar1 = (IOException *)__cxa_allocate_exception(0x28);
    local_60._0_8_ = (long)&local_60 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Creation of ply header has been completed","");
    gutil::IOException::IOException(pIVar1,(string *)&local_60);
    __cxa_throw(pIVar1,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  this_00 = this->element;
  if (this_00 != (PLYElement *)0x0) {
    anon_unknown_3::PLYProperty::PLYProperty(&local_60,name,tvalue,this->enc);
    PLYElement::addProperty(this_00,&local_60);
    if (local_60.value != (PLYValue *)0x0) {
      (*(local_60.value)->_vptr_PLYValue[1])();
    }
    if (local_60.name._M_dataplus._M_p != (pointer)((long)&local_60 + 0x18U)) {
      operator_delete(local_60.name._M_dataplus._M_p);
    }
    return;
  }
  pIVar1 = (IOException *)__cxa_allocate_exception(0x28);
  local_60._0_8_ = (long)&local_60 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"PLYWriter: Adding a property without an element","");
  gutil::IOException::IOException(pIVar1,(string *)&local_60);
  __cxa_throw(pIVar1,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void PLYWriter::addProperty(const std::string &name, ply_type tvalue)
{
  if (header_complete)
  {
    throw gutil::IOException("Creation of ply header has been completed");
  }

  if (element == 0)
  {
    throw gutil::IOException("PLYWriter: Adding a property without an element");
  }

  element->addProperty(PLYProperty(name, tvalue, enc));
}